

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TablePushBackgroundChannel(void)

{
  ImGuiWindow *pIVar1;
  ImGuiTable *pIVar2;
  ImGuiContext *clip_rect;
  ImGuiTable *table;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  clip_rect = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar2 = GImGui->CurrentTable;
  (pIVar2->HostBackupInnerClipRect).Min = (pIVar1->ClipRect).Min;
  (pIVar2->HostBackupInnerClipRect).Max = (pIVar1->ClipRect).Max;
  SetWindowClipRectBeforeSetChannel
            ((ImGuiWindow *)CONCAT44(table._4_4_,table._0_4_),(ImRect *)clip_rect);
  ImDrawListSplitter::SetCurrentChannel((ImDrawListSplitter *)g,(ImDrawList *)window,table._4_4_);
  return;
}

Assistant:

void ImGui::TablePushBackgroundChannel()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiTable* table = g.CurrentTable;

    // Optimization: avoid SetCurrentChannel() + PushClipRect()
    table->HostBackupInnerClipRect = window->ClipRect;
    SetWindowClipRectBeforeSetChannel(window, table->Bg2ClipRectForDrawCmd);
    table->DrawSplitter.SetCurrentChannel(window->DrawList, table->Bg2DrawChannelCurrent);
}